

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# run.c
# Opt level: O2

void runpushcstr(runcxdef *ctx,char *str,size_t len,int sav)

{
  byte *pbVar1;
  byte bVar2;
  runsdef *prVar3;
  undefined4 uVar4;
  undefined8 in_RAX;
  uchar *puVar5;
  byte *pbVar6;
  uint16_t tmp;
  long lVar7;
  undefined1 local_27 [7];
  
  pbVar1 = (byte *)(str + len);
  for (pbVar6 = (byte *)str; pbVar6 < pbVar1; pbVar6 = pbVar6 + 1) {
    bVar2 = *pbVar6;
    if (((bVar2 < 0xe) && ((0x2600U >> (bVar2 & 0x1f) & 1) != 0)) || (bVar2 == 0x5c)) {
      len = len + 1;
    }
  }
  puVar5 = ctx->runcxhp;
  lVar7 = len + 2;
  if ((uint)(*(int *)&ctx->runcxhtop - (int)puVar5) <= (uint)lVar7) {
    runhcmp(ctx,(uint)lVar7,sav,(runsdef *)0x0,(runsdef *)0x0,(runsdef *)0x0);
    puVar5 = ctx->runcxhp;
  }
  *(short *)puVar5 = (short)lVar7;
  pbVar6 = ctx->runcxhp + 2;
  do {
    if (pbVar1 <= str) {
      prVar3 = ctx->runcxsp;
      puVar5 = ctx->runcxhp;
      ctx->runcxhp = puVar5 + lVar7;
      prVar3->runstyp = '\x03';
      local_27._0_4_ = (undefined4)((ulong)in_RAX >> 8);
      uVar4 = local_27._0_4_;
      local_27._3_4_ = (undefined4)((ulong)in_RAX >> 0x20);
      *(undefined4 *)&prVar3->field_0x1 = uVar4;
      *(undefined4 *)&prVar3->field_0x4 = local_27._3_4_;
      (prVar3->runsv).runsvstr = puVar5;
      ctx->runcxsp = ctx->runcxsp + 1;
      return;
    }
    bVar2 = *str;
    if (bVar2 == 9) {
      pbVar6[0] = 0x5c;
      pbVar6[1] = 9;
LAB_0021ee51:
      pbVar6 = pbVar6 + 2;
    }
    else {
      if ((bVar2 == 10) || (bVar2 == 0xd)) {
        pbVar6[0] = 0x5c;
        pbVar6[1] = 0x6e;
        goto LAB_0021ee51;
      }
      if (bVar2 == 0x5c) {
        pbVar6[0] = 0x5c;
        pbVar6[1] = 0x5c;
        goto LAB_0021ee51;
      }
      *pbVar6 = bVar2;
      pbVar6 = pbVar6 + 1;
    }
    str = (char *)((byte *)str + 1);
  } while( true );
}

Assistant:

void runpushcstr(runcxdef *ctx, char *str, size_t len, int sav)
{
    char    *p;
    char    *dst;
    size_t   need;
    runsdef  val;
    
    /* determine how much space we'll need after converting escapes */
    for (p = str, need = len ; p < str + len ; ++p)
    {
        switch(*p)
        {
        case '\\':
        case '\n':
        case '\r':
        case '\t':
            /* these characters need to be escaped */
            ++need;
            break;

        default:
            break;
        }
    }

    /* reserve space */
    runhres(ctx, need + 2, sav);

    /* set up the length prefix */
    oswp2(ctx->runcxhp, need + 2);

    /* copy the string, expanding escapes */
    for (p = str, dst = (char *)ctx->runcxhp + 2 ; p < str + len ; ++p)
    {
        switch(*p)
        {
        case '\\':
            *dst++ = '\\';
            *dst++ = '\\';
            break;

        case '\n':
        case '\r':
            *dst++ = '\\';
            *dst++ = 'n';
            break;

        case '\t':
            *dst++ = '\\';
            *dst++ = '\t';
            break;

        default:
            *dst++ = *p;
            break;
        }
    }

    /* push the return value */
    val.runsv.runsvstr = ctx->runcxhp;
    val.runstyp = DAT_SSTRING;
    ctx->runcxhp += need + 2;
    runrepush(ctx, &val);
}